

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::BatchnormLayerParams::SharedDtor(BatchnormLayerParams *this)

{
  if (this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    if (this->gamma_ != (WeightParams *)0x0) {
      (*(this->gamma_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
      if (this->beta_ != (WeightParams *)0x0) {
        (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
      }
      if (this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
        if (this->mean_ != (WeightParams *)0x0) {
          (*(this->mean_->super_MessageLite)._vptr_MessageLite[1])();
        }
        if ((this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) &&
           (this->variance_ != (WeightParams *)0x0)) {
          (*(this->variance_->super_MessageLite)._vptr_MessageLite[1])();
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void BatchnormLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete gamma_;
  }
  if (this != internal_default_instance()) {
    delete beta_;
  }
  if (this != internal_default_instance()) {
    delete mean_;
  }
  if (this != internal_default_instance()) {
    delete variance_;
  }
}